

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void update_delta_lf_for_row_mt(AV1_COMP *cpi)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long in_RDI;
  int lf_id_1;
  int lf_id;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO **mi;
  int idx_str;
  int mi_col;
  int mi_row;
  TileInfo *tile_info;
  TileDataEnc *tile_data;
  int col;
  int row;
  int frame_lf_count;
  int mib_size;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int local_60;
  int local_5c;
  int local_40;
  int local_3c;
  int local_28;
  int local_24;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 0x42008) + 0x20);
  iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  iVar4 = 2;
  if (1 < iVar3) {
    iVar4 = 4;
  }
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x42024); local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x42020); local_28 = local_28 + 1) {
      piVar5 = (int *)(*(long *)(in_RDI + 0x71318) +
                      (long)(local_24 * *(int *)(in_RDI + 0x42020) + local_28) * 0x5d10);
      for (local_3c = *piVar5; local_3c < piVar5[1]; local_3c = iVar1 + local_3c) {
        if (local_3c == *piVar5) {
          iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
          av1_reset_loop_filter_delta((MACROBLOCKD *)(in_RDI + 0x151d0),iVar3);
        }
        for (local_40 = piVar5[2]; local_40 < piVar5[3]; local_40 = iVar1 + local_40) {
          pcVar2 = *(char **)(*(long *)(in_RDI + 0x3c1b8) +
                             (long)(*(int *)(in_RDI + 0x3c1c4) * local_3c + local_40) * 8);
          if ((pcVar2[0x90] == '\x01') && (*pcVar2 == *(char *)(*(long *)(in_RDI + 0x42008) + 0x1c))
             ) {
            for (local_5c = 0; local_5c < iVar4; local_5c = local_5c + 1) {
              pcVar2[(long)local_5c + 0xa3] = *(char *)(in_RDI + 0x17bd1 + (long)local_5c);
            }
            pcVar2[0xa2] = *(char *)(in_RDI + 0x17bd0);
          }
          else if (*(int *)(in_RDI + 0x41ee0) == 0) {
            *(char *)(in_RDI + 0x17bd0) = pcVar2[0xa2];
          }
          else {
            for (local_60 = 0; local_60 < iVar4; local_60 = local_60 + 1) {
              *(char *)(in_RDI + 0x17bd1 + (long)local_60) = pcVar2[(long)local_60 + 0xa3];
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void update_delta_lf_for_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &cpi->td.mb.e_mbd;
  const int mib_size = cm->seq_params->mib_size;
  const int frame_lf_count =
      av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
  for (int row = 0; row < cm->tiles.rows; row++) {
    for (int col = 0; col < cm->tiles.cols; col++) {
      TileDataEnc *tile_data = &cpi->tile_data[row * cm->tiles.cols + col];
      const TileInfo *const tile_info = &tile_data->tile_info;
      for (int mi_row = tile_info->mi_row_start; mi_row < tile_info->mi_row_end;
           mi_row += mib_size) {
        if (mi_row == tile_info->mi_row_start)
          av1_reset_loop_filter_delta(xd, av1_num_planes(cm));
        for (int mi_col = tile_info->mi_col_start;
             mi_col < tile_info->mi_col_end; mi_col += mib_size) {
          const int idx_str = cm->mi_params.mi_stride * mi_row + mi_col;
          MB_MODE_INFO **mi = cm->mi_params.mi_grid_base + idx_str;
          MB_MODE_INFO *mbmi = mi[0];
          if (mbmi->skip_txfm == 1 &&
              (mbmi->bsize == cm->seq_params->sb_size)) {
            for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id)
              mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id];
            mbmi->delta_lf_from_base = xd->delta_lf_from_base;
          } else {
            if (cm->delta_q_info.delta_lf_multi) {
              for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id)
                xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
            } else {
              xd->delta_lf_from_base = mbmi->delta_lf_from_base;
            }
          }
        }
      }
    }
  }
}